

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  uint uVar5;
  float *__dest;
  ImGuiContext *pIVar6;
  int iVar7;
  float *pfVar8;
  uint uVar9;
  ImGuiWindow *window;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  fVar12 = (pIVar2->DC).ItemWidth;
  if (fVar12 < 0.0) {
    IVar10 = ImGui::GetContentRegionAvail();
    fVar11 = fVar12 + IVar10.x;
    fVar12 = 1.0;
    if (1.0 <= fVar11) {
      fVar12 = fVar11;
    }
  }
  pIVar3 = GImGui;
  iVar7 = components + -1;
  fVar11 = (pIVar6->Style).ItemInnerSpacing.x;
  fVar13 = (float)(int)(((float)(int)fVar12 - fVar11 * (float)iVar7) / (float)components);
  fVar14 = 1.0;
  if (1.0 <= fVar13) {
    fVar14 = fVar13;
  }
  fVar11 = (float)(int)((float)(int)fVar12 - (fVar11 + fVar14) * (float)iVar7);
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  uVar5 = (pIVar2->DC).ItemWidthStack.Size;
  uVar9 = (pIVar2->DC).ItemWidthStack.Capacity;
  if (uVar5 != uVar9) {
    __dest = (pIVar2->DC).ItemWidthStack.Data;
    goto LAB_00132e27;
  }
  if (uVar5 == 0) {
    uVar4 = 8;
  }
  else {
    uVar4 = (int)uVar5 / 2 + uVar5;
  }
  uVar9 = uVar5 + 1;
  if ((int)(uVar5 + 1) < (int)uVar4) {
    uVar9 = uVar4;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (float *)(*(pIVar3->IO).MemAllocFn)((long)(int)uVar9 << 2);
  pfVar8 = (pIVar2->DC).ItemWidthStack.Data;
  if (pfVar8 == (float *)0x0) {
LAB_00132e04:
    pfVar8 = (float *)0x0;
    pIVar6 = GImGui;
  }
  else {
    memcpy(__dest,pfVar8,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
    pIVar6 = GImGui;
    pfVar8 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar8 == (float *)0x0) goto LAB_00132e04;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar6->IO).MemFreeFn)(pfVar8);
  (pIVar2->DC).ItemWidthStack.Data = __dest;
  (pIVar2->DC).ItemWidthStack.Capacity = uVar9;
  uVar5 = (pIVar2->DC).ItemWidthStack.Size;
LAB_00132e27:
  uVar4 = uVar5 + 1;
  (pIVar2->DC).ItemWidthStack.Size = uVar4;
  __dest[(int)uVar5] = fVar12;
  if (1 < components) {
    do {
      pIVar6 = GImGui;
      uVar5 = uVar4;
      if (uVar4 == uVar9) {
        if (uVar9 == 0) {
          uVar5 = 8;
        }
        else {
          uVar5 = (int)uVar9 / 2 + uVar9;
        }
        uVar9 = uVar9 + 1;
        if ((int)uVar9 < (int)uVar5) {
          uVar9 = uVar5;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (float *)(*(pIVar6->IO).MemAllocFn)((long)(int)uVar9 << 2);
        pfVar8 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar8 == (float *)0x0) {
LAB_00132ece:
          pfVar8 = (float *)0x0;
          pIVar6 = GImGui;
        }
        else {
          memcpy(__dest,pfVar8,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          pIVar6 = GImGui;
          pfVar8 = (pIVar2->DC).ItemWidthStack.Data;
          if (pfVar8 == (float *)0x0) goto LAB_00132ece;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(pIVar6->IO).MemFreeFn)(pfVar8);
        (pIVar2->DC).ItemWidthStack.Data = __dest;
        (pIVar2->DC).ItemWidthStack.Capacity = uVar9;
        uVar5 = (pIVar2->DC).ItemWidthStack.Size;
      }
      uVar4 = uVar5 + 1;
      (pIVar2->DC).ItemWidthStack.Size = uVar4;
      __dest[(int)uVar5] = fVar14;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  if ((int)uVar4 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x365,"value_type &ImVector<float>::back() [T = float]");
  }
  (pIVar2->DC).ItemWidth = __dest[(ulong)uVar4 - 1];
  return;
}

Assistant:

static void PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = ImGui::CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}